

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::ClientHook> * __thiscall
kj::Own<capnp::ClientHook>::operator=(Own<capnp::ClientHook> *this,Own<capnp::ClientHook> *other)

{
  ClientHook *object;
  Dispose_<capnp::ClientHook,_true> *this_00;
  ClientHook *pCVar1;
  Disposer *in_RDX;
  
  object = (ClientHook *)this->disposer;
  this_00 = (Dispose_<capnp::ClientHook,_true> *)this->ptr;
  pCVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pCVar1;
  other->ptr = (ClientHook *)0x0;
  if (this_00 != (Dispose_<capnp::ClientHook,_true> *)0x0) {
    Disposer::Dispose_<capnp::ClientHook,_true>::dispose(this_00,object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }